

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanorod_pentBuilderCmd.cpp
# Opt level: O2

int cmdline_parser_dump(FILE *outfile,gengetopt_args_info *args_info)

{
  char **in_RCX;
  char **arg;
  int iVar1;
  char **in_R8;
  
  if (outfile == (FILE *)0x0) {
    fprintf(_stderr,"%s: cannot dump options to stream\n","nanorod_pentBuilder");
    iVar1 = 1;
  }
  else {
    if (args_info->help_given != 0) {
      fprintf((FILE *)outfile,"%s\n","help");
    }
    if (args_info->version_given != 0) {
      fprintf((FILE *)outfile,"%s\n","version");
    }
    if (args_info->output_given != 0) {
      write_into_file(outfile,"output",args_info->output_orig,in_RCX);
    }
    if (args_info->latticeConstant_given != 0) {
      write_into_file(outfile,"latticeConstant",args_info->latticeConstant_orig,in_RCX);
    }
    if (args_info->radius_given != 0) {
      write_into_file(outfile,"radius",args_info->radius_orig,in_RCX);
    }
    if (args_info->length_given != 0) {
      write_into_file(outfile,"length",args_info->length_orig,in_RCX);
    }
    write_multiple_into_file
              (outfile,args_info->shellRadius_given,"shellRadius",args_info->shellRadius_orig,in_R8)
    ;
    arg = args_info->molFraction_orig;
    write_multiple_into_file(outfile,args_info->molFraction_given,"molFraction",arg,in_R8);
    if (args_info->vacancyPercent_given != 0) {
      write_into_file(outfile,"vacancyPercent",args_info->vacancyPercent_orig,arg);
    }
    if (args_info->vacancyInnerRadius_given != 0) {
      write_into_file(outfile,"vacancyInnerRadius",args_info->vacancyInnerRadius_orig,arg);
    }
    iVar1 = 0;
    if (args_info->vacancyOuterRadius_given != 0) {
      write_into_file(outfile,"vacancyOuterRadius",args_info->vacancyOuterRadius_orig,arg);
    }
  }
  return iVar1;
}

Assistant:

int
cmdline_parser_dump(FILE *outfile, struct gengetopt_args_info *args_info)
{
  int i = 0;

  if (!outfile)
    {
      fprintf (stderr, "%s: cannot dump options to stream\n", CMDLINE_PARSER_PACKAGE);
      return EXIT_FAILURE;
    }

  if (args_info->help_given)
    write_into_file(outfile, "help", 0, 0 );
  if (args_info->version_given)
    write_into_file(outfile, "version", 0, 0 );
  if (args_info->output_given)
    write_into_file(outfile, "output", args_info->output_orig, 0);
  if (args_info->latticeConstant_given)
    write_into_file(outfile, "latticeConstant", args_info->latticeConstant_orig, 0);
  if (args_info->radius_given)
    write_into_file(outfile, "radius", args_info->radius_orig, 0);
  if (args_info->length_given)
    write_into_file(outfile, "length", args_info->length_orig, 0);
  write_multiple_into_file(outfile, args_info->shellRadius_given, "shellRadius", args_info->shellRadius_orig, 0);
  write_multiple_into_file(outfile, args_info->molFraction_given, "molFraction", args_info->molFraction_orig, 0);
  if (args_info->vacancyPercent_given)
    write_into_file(outfile, "vacancyPercent", args_info->vacancyPercent_orig, 0);
  if (args_info->vacancyInnerRadius_given)
    write_into_file(outfile, "vacancyInnerRadius", args_info->vacancyInnerRadius_orig, 0);
  if (args_info->vacancyOuterRadius_given)
    write_into_file(outfile, "vacancyOuterRadius", args_info->vacancyOuterRadius_orig, 0);
  

  i = EXIT_SUCCESS;
  return i;
}